

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderFragDataTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::FragDataDrawBuffersCase::iterate
          (FragDataDrawBuffersCase *this)

{
  RenderContext *renderCtx;
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RGBA RVar4;
  ProgramSources *pPVar5;
  undefined4 extraout_var;
  TypedObjectWrapper<(glu::ObjectType)2> *pTVar6;
  undefined4 extraout_var_00;
  NotSupportedError *this_00;
  TestError *this_01;
  RGBA expectedColor;
  char *description;
  int ndx_1;
  int iVar7;
  long lVar8;
  byte bVar9;
  int ndx;
  uint uVar10;
  bool bVar11;
  Vec4 VVar12;
  undefined4 local_420;
  allocator<char> local_419;
  FragDataDrawBuffersCase *local_418;
  RenderContext *local_410;
  Surface result;
  RGBA local_3e4;
  deUint8 indices [6];
  float positions [8];
  Framebuffer fbo;
  Renderbuffer colorBuf0;
  float colors [16];
  Renderbuffer colorBuf1;
  deUint32 drawBuffers [2];
  IndexType local_320 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [10];
  pointer local_278;
  undefined1 uStack_270;
  undefined7 uStack_26f;
  undefined1 uStack_268;
  undefined8 uStack_267;
  VertexArrayBinding vertexArrays [2];
  ShaderProgram program;
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_418 = this;
  memset(drawBuffers,0,0xac);
  local_278 = (pointer)0x0;
  uStack_270 = 0;
  uStack_26f = 0;
  uStack_268 = 0;
  uStack_267 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)positions,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,(allocator<char> *)&fbo);
  glu::VertexSource::VertexSource((VertexSource *)vertexArrays,(string *)positions);
  pPVar5 = glu::ProgramSources::operator<<
                     ((ProgramSources *)drawBuffers,(ShaderSource *)vertexArrays);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,
             "varying mediump vec4 v_color;\nuniform mediump int u_index;\nvoid main (void)\n{\n\tgl_FragData[u_index] = v_color;\n}\n"
             ,(allocator<char> *)&colorBuf0);
  glu::FragmentSource::FragmentSource((FragmentSource *)colors,(string *)&result);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)colors);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,pPVar5);
  std::__cxx11::string::~string((string *)(colors + 2));
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&vertexArrays[0].binding.name);
  std::__cxx11::string::~string((string *)positions);
  glu::ProgramSources::~ProgramSources((ProgramSources *)drawBuffers);
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar8 = CONCAT44(extraout_var,iVar2);
  if (program.m_program.m_info.linkOk == true) {
    local_420 = (**(code **)(lVar8 + 0xb48))(program.m_program.m_program,"u_index");
  }
  else {
    local_420 = 0xffffffff;
  }
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&fbo,renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&colorBuf0,renderCtx);
  local_410 = renderCtx;
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&colorBuf1,renderCtx);
  positions[4] = -1.0;
  positions[5] = 1.0;
  positions[6] = 1.0;
  positions[7] = 1.0;
  positions[0] = -1.0;
  positions[1] = -1.0;
  positions[2] = 1.0;
  positions[3] = -1.0;
  colors[0xc] = 0.0;
  colors[0xd] = 1.0;
  colors[0xe] = 0.0;
  colors[0xf] = 1.0;
  colors[8] = 0.0;
  colors[9] = 1.0;
  colors[10] = 0.0;
  colors[0xb] = 1.0;
  colors[4] = 0.0;
  colors[5] = 1.0;
  colors[6] = 0.0;
  colors[7] = 1.0;
  colors[0] = 0.0;
  colors[1] = 1.0;
  colors[2] = 0.0;
  colors[3] = 1.0;
  indices[4] = '\x01';
  indices[5] = '\x03';
  indices[0] = '\0';
  indices[1] = '\x01';
  indices[2] = '\x02';
  indices[3] = '\x02';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)drawBuffers,"a_position",(allocator<char> *)&local_3e4);
  iVar2 = 2;
  glu::va::Float(vertexArrays,(string *)drawBuffers,2,4,0,positions);
  std::__cxx11::string::string<std::allocator<char>>((string *)&result,"a_color",&local_419);
  glu::va::Float(vertexArrays + 1,(string *)&result,4,4,0,colors);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)drawBuffers);
  glu::operator<<(((local_418->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  &program);
  if (program.m_program.m_info.linkOk == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)drawBuffers,"Dynamic indexing of gl_FragData[] not supported",
               (allocator<char> *)&result);
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)drawBuffers);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar8 + 0x78))(0x8d40);
  uVar10 = 0;
  while (bVar11 = iVar2 != 0, iVar2 = iVar2 + -1, bVar11) {
    pTVar6 = &colorBuf1;
    if (uVar10 == 0) {
      pTVar6 = &colorBuf0;
    }
    dVar3 = (pTVar6->super_ObjectWrapper).m_object;
    (**(code **)(lVar8 + 0xa0))(0x8d41,dVar3);
    (**(code **)(lVar8 + 0x1238))(0x8d41,0x8058,0x80,0x80);
    (**(code **)(lVar8 + 0x688))(0x8d40,uVar10 | 0x8ce0,0x8d41,dVar3);
    uVar10 = uVar10 + 1;
  }
  iVar2 = (**(code **)(lVar8 + 0x170))(0x8d40);
  if (iVar2 == 0x8cd5) {
    drawBuffers[0] = 0x8ce0;
    drawBuffers[1] = 0x8ce1;
    (**(code **)(lVar8 + 0x560))(2);
    pcVar1 = *(code **)(lVar8 + 0x1a8);
    result.m_width = -0xffff01;
    VVar12 = tcu::RGBA::toVec((RGBA *)&result);
    (*pcVar1)(VVar12.m_data[0],VVar12.m_data._8_8_,0x1800,0,drawBuffers);
    pcVar1 = *(code **)(lVar8 + 0x1a8);
    result.m_width = -0xffff01;
    VVar12 = tcu::RGBA::toVec((RGBA *)&result);
    (*pcVar1)(VVar12.m_data[0],VVar12.m_data._8_8_,0x1800,1,drawBuffers);
    (**(code **)(lVar8 + 0x1a00))(0,0,0x80,0x80);
    (**(code **)(lVar8 + 0x1680))(program.m_program.m_program);
    dVar3 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar3,"Setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                    ,0x131);
    drawBuffers = (deUint32  [2])
                  ((local_418->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::operator<<((ostream *)local_320,
                    "Drawing to attachments 0 and 1, expecting only attachment 0 to change.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)drawBuffers,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    iVar2 = 2;
    for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
      (**(code **)(lVar8 + 0x14f0))(local_420,iVar7);
      drawBuffers[0] = 0;
      drawBuffers[1] = 6;
      local_320[0] = INDEXTYPE_UINT8;
      local_318[0]._0_8_ = (pointer)indices;
      glu::draw(local_410,program.m_program.m_program,2,vertexArrays,(PrimitiveList *)drawBuffers,
                (DrawUtilCallback *)0x0);
    }
    dVar3 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar3,"Rendering failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                    ,0x13b);
    tcu::Surface::Surface(&result,0x80,0x80);
    iVar7 = (*local_410->_vptr_RenderContext[4])();
    RVar4 = tcu::PixelFormat::getColorThreshold
                      ((PixelFormat *)(CONCAT44(extraout_var_00,iVar7) + 8));
    drawBuffers[0] = RVar4.m_value;
    local_3e4.m_value = 0x1010101;
    RVar4 = tcu::operator+((RGBA *)drawBuffers,&local_3e4);
    bVar9 = 1;
    uVar10 = 0;
    while (bVar11 = iVar2 != 0, iVar2 = iVar2 + -1, bVar11) {
      drawBuffers = (deUint32  [2])
                    ((local_418->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      std::operator<<((ostream *)local_320,"Verifying attachment ");
      std::ostream::operator<<((ostringstream *)local_320,uVar10);
      std::operator<<((ostream *)local_320,"...");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)drawBuffers,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      (**(code **)(lVar8 + 0x1218))(uVar10 | 0x8ce0);
      tcu::Surface::getAccess((PixelBufferAccess *)drawBuffers,&result);
      glu::readPixels(local_410,0,0,(PixelBufferAccess *)drawBuffers);
      dVar3 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar3,"Reading pixels failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                      ,0x148);
      expectedColor.m_value = 0xff0000ff;
      if (uVar10 == 0) {
        expectedColor.m_value = 0xff00ff00;
      }
      bVar11 = compareSingleColor(((local_418->super_TestCase).super_TestCase.super_TestNode.
                                  m_testCtx)->m_log,&result,expectedColor,RVar4);
      bVar9 = bVar9 & bVar11;
      uVar10 = uVar10 + 1;
    }
    description = "Image comparison failed";
    if (bVar9 != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((local_418->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~bVar9 & QP_TEST_RESULT_FAIL,description);
    tcu::Surface::~Surface(&result);
    lVar8 = 0x58;
    do {
      std::__cxx11::string::~string((string *)((long)&vertexArrays[0].binding.type + lVar8));
      lVar8 = lVar8 + -0x50;
    } while (lVar8 != -0x48);
    glu::ObjectWrapper::~ObjectWrapper(&colorBuf1.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&colorBuf0.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
    glu::ShaderProgram::~ShaderProgram(&program);
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,
             "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
             ,0x124);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&		renderCtx		= m_context.getRenderContext();
		const glu::ShaderProgram		program			(renderCtx, glu::ProgramSources()
															<< glu::VertexSource(
																"attribute highp vec4 a_position;\n"
																"attribute highp vec4 a_color;\n"
																"varying mediump vec4 v_color;\n"
																"void main (void)\n"
																"{\n"
																"	gl_Position = a_position;\n"
																"	v_color = a_color;\n"
																"}\n")
															<< glu::FragmentSource(
																"varying mediump vec4 v_color;\n"
																"uniform mediump int u_index;\n"
																"void main (void)\n"
																"{\n"
																"	gl_FragData[u_index] = v_color;\n"
																"}\n"));
		const glw::Functions&			gl				= renderCtx.getFunctions();
		const int						width			= 128;
		const int						height			= 128;
		const int						indexLoc		= program.isOk() ? gl.getUniformLocation(program.getProgram(), "u_index") : -1;
		const glu::Framebuffer			fbo				(renderCtx);
		const glu::Renderbuffer			colorBuf0		(renderCtx);
		const glu::Renderbuffer			colorBuf1		(renderCtx);

		const float positions[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			-1.0f, +1.0f,
			+1.0f, +1.0f
		};
		const float colors[] =
		{
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f
		};
		const deUint8	indices[]		= { 0, 1, 2, 2, 1, 3 };

		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	2, 4, 0, &positions[0]),
			glu::va::Float("a_color",		4, 4, 0, &colors[0])
		};

		m_testCtx.getLog() << program;

		if (!program.isOk())
			throw tcu::NotSupportedError("Dynamic indexing of gl_FragData[] not supported");

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		for (int ndx = 0; ndx < 2; ndx++)
		{
			const deUint32	rbo	= ndx == 0 ? *colorBuf0 : *colorBuf1;

			gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
			gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, width, height);
			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0+ndx, GL_RENDERBUFFER, rbo);
		}
		TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

		{
			const deUint32 drawBuffers[] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
			gl.drawBuffers(DE_LENGTH_OF_ARRAY(drawBuffers), &drawBuffers[0]);
		}

		gl.clearBufferfv(GL_COLOR, 0, tcu::RGBA::red().toVec().getPtr());
		gl.clearBufferfv(GL_COLOR, 1, tcu::RGBA::red().toVec().getPtr());

		gl.viewport		(0, 0, width, height);
		gl.useProgram	(program.getProgram());

		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		m_testCtx.getLog() << TestLog::Message << "Drawing to attachments 0 and 1, expecting only attachment 0 to change." << TestLog::EndMessage;

		for (int ndx = 0; ndx < 2; ndx++)
		{
			gl.uniform1i(indexLoc, ndx);
			glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed");

		{
			tcu::Surface		result		(width, height);
			const tcu::RGBA		threshold	= renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
			bool				allOk		= true;

			for (int ndx = 0; ndx < 2; ndx++)
			{
				m_testCtx.getLog() << TestLog::Message << "Verifying attachment " << ndx << "..." << TestLog::EndMessage;

				gl.readBuffer(GL_COLOR_ATTACHMENT0+ndx);
				glu::readPixels(renderCtx, 0, 0, result.getAccess());
				GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

				if (!compareSingleColor(m_testCtx.getLog(), result, ndx == 0 ? tcu::RGBA::green() : tcu::RGBA::red(), threshold))
					allOk = false;
			}

			m_testCtx.setTestResult(allOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									allOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}